

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O1

void PHYSFS_utf8ToUcs4(char *src,PHYSFS_uint32 *dst,PHYSFS_uint64 len)

{
  PHYSFS_uint32 PVar1;
  PHYSFS_uint32 PVar2;
  ulong uVar3;
  char *local_28;
  
  uVar3 = len - 4;
  local_28 = src;
  do {
    if (uVar3 < 4) break;
    PVar1 = __PHYSFS_utf8codepoint(&local_28);
    if (PVar1 != 0) {
      PVar2 = PVar1;
      if (PVar1 == 0xffffffff) {
        PVar2 = 0x3f;
      }
      *dst = PVar2;
      dst = dst + 1;
      uVar3 = uVar3 - 4;
    }
  } while (PVar1 != 0);
  *dst = 0;
  return;
}

Assistant:

void PHYSFS_utf8ToUcs4(const char *src, PHYSFS_uint32 *dst, PHYSFS_uint64 len)
{
    len -= sizeof (PHYSFS_uint32);   /* save room for null char. */
    while (len >= sizeof (PHYSFS_uint32))
    {
        PHYSFS_uint32 cp = __PHYSFS_utf8codepoint(&src);
        if (cp == 0)
            break;
        else if (cp == UNICODE_BOGUS_CHAR_VALUE)
            cp = UNICODE_BOGUS_CHAR_CODEPOINT;
        *(dst++) = cp;
        len -= sizeof (PHYSFS_uint32);
    } /* while */

    *dst = 0;
}